

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-parse.h
# Opt level: O0

void fy_advance(fy_parser *fyp,int c)

{
  _Bool _Var1;
  int iVar2;
  size_t advance;
  _Bool local_15;
  _Bool is_line_break;
  int c_local;
  fy_parser *fyp_local;
  
  advance = fy_utf8_width(c);
  fy_advance_octets(fyp,advance);
  if ((c == 0xd) && (iVar2 = fy_parse_peek(fyp), iVar2 == 10)) {
    fy_advance_octets(fyp,1);
    local_15 = true;
  }
  else {
    local_15 = fyp_is_lb(fyp,c);
  }
  if (local_15 == false) {
    if ((fyp->tabsize == 0) || (_Var1 = fy_is_tab(c), !_Var1)) {
      fyp->column = fyp->column + 1;
      fyp->nontab_column = fyp->nontab_column + 1;
    }
    else {
      fyp->column = (fyp->tabsize - fyp->column % fyp->tabsize) + fyp->column;
      fyp->nontab_column = fyp->nontab_column + 1;
    }
  }
  else {
    fyp->column = 0;
    fyp->nontab_column = 0;
    fyp->line = fyp->line + 1;
  }
  return;
}

Assistant:

static inline void fy_advance(struct fy_parser *fyp, int c) {
    bool is_line_break = false;

    /* skip this character */
    fy_advance_octets(fyp, fy_utf8_width(c));

    /* first check for CR/LF */
    if (c == '\r' && fy_parse_peek(fyp) == '\n') {
        fy_advance_octets(fyp, 1);
        is_line_break = true;
    } else if (fyp_is_lb(fyp, c))
        is_line_break = true;

    if (is_line_break) {
        fyp->column = 0;
        fyp->nontab_column = 0;
        fyp->line++;
    } else if (fyp->tabsize && fy_is_tab(c)) {
        fyp->column += (fyp->tabsize - (fyp->column % fyp->tabsize));
        fyp->nontab_column++;
    } else {
        fyp->column++;
        fyp->nontab_column++;
    }
}